

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_SpawnMissile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClassActor *type_00;
  VMValue *pVVar1;
  AActor *pAVar2;
  bool bVar3;
  bool local_74;
  bool local_71;
  AActor *local_70;
  bool local_63;
  AActor *state;
  AActor *owner;
  MetaClass *type;
  AActor *dest;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1978,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1978,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (pAVar2 != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1978,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1979,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
    bVar3 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar3) {
    if (param[1].field_0.field_1.a == (void *)0x0) {
      NullParam("\"dest\"");
      local_70 = (AActor *)param[1].field_0.field_1.a;
    }
    else {
      local_70 = (AActor *)param[1].field_0.field_1.a;
    }
    local_71 = true;
    if (local_70 != (AActor *)0x0) {
      local_71 = DObject::IsKindOf((DObject *)local_70,AActor::RegistrationInfo.MyClass);
    }
    if (local_71 == false) {
      __assert_fail("dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1979,
                    "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x197a,
                    "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar3 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[2].field_0.field_1.atag != 1)) {
      bVar3 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (bVar3) {
      type_00 = (PClassActor *)param[2].field_0.field_1.a;
      local_74 = true;
      if (type_00 != (PClassActor *)0x0) {
        local_74 = PClass::IsDescendantOf((PClass *)type_00,AActor::RegistrationInfo.MyClass);
      }
      if (local_74 == false) {
        __assert_fail("type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x197a,
                      "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (numparam < 4) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        bVar3 = false;
        if ((pVVar1->field_0).field_3.Type == '\x03') {
          pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
          bVar3 = true;
          if ((pVVar1->field_0).field_1.atag != 1) {
            pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
            bVar3 = (pVVar1->field_0).field_1.a == (void *)0x0;
          }
        }
        if (!bVar3) {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x197b,
                        "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        state = (AActor *)(pVVar1->field_0).field_1.a;
      }
      else {
        bVar3 = false;
        if ((param[3].field_0.field_3.Type == '\x03') &&
           (bVar3 = true, param[3].field_0.field_1.atag != 1)) {
          bVar3 = param[3].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar3) {
          __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x197b,
                        "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        state = (AActor *)param[3].field_0.field_1.a;
      }
      pAVar2 = P_SpawnMissile(pAVar2,local_70,type_00,state);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x197c,
                        "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,pAVar2,1);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x197a,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1979,
                "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	PARAM_OBJECT_DEF(owner, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissile(self, dest, type, owner));
}